

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase520::run(TestCase520 *this)

{
  bool bVar1;
  ListReader local_a28;
  Builder root;
  Reader reader;
  PointerBuilder local_998;
  ListElementCount local_97c;
  SegmentReader *local_978;
  CapTableReader *pCStack_970;
  byte *local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  int iStack_950;
  undefined4 uStack_94c;
  SegmentReader *local_948;
  CapTableReader *pCStack_940;
  byte *local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  int iStack_920;
  undefined4 uStack_91c;
  SegmentReader *local_918;
  CapTableReader *pCStack_910;
  byte *local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  int iStack_8f0;
  undefined4 uStack_8ec;
  SegmentReader *local_8e8;
  CapTableReader *pCStack_8e0;
  byte *local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  int iStack_8c0;
  undefined4 uStack_8bc;
  SegmentReader *local_8b8;
  CapTableReader *pCStack_8b0;
  byte *local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  int iStack_890;
  undefined4 uStack_88c;
  SegmentReader *local_888;
  CapTableReader *pCStack_880;
  byte *local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  int iStack_860;
  undefined4 uStack_85c;
  SegmentReader *local_858;
  CapTableReader *pCStack_850;
  byte *local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  int iStack_830;
  undefined4 uStack_82c;
  SegmentReader *local_828;
  CapTableReader *pCStack_820;
  byte *local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  int iStack_800;
  undefined4 uStack_7fc;
  SegmentReader *local_7f8;
  CapTableReader *pCStack_7f0;
  byte *local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  int iStack_7d0;
  undefined4 uStack_7cc;
  SegmentReader *local_7c8;
  CapTableReader *pCStack_7c0;
  byte *local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  int iStack_7a0;
  undefined4 uStack_79c;
  SegmentReader *local_798;
  CapTableReader *pCStack_790;
  byte *local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  int iStack_770;
  undefined4 uStack_76c;
  SegmentReader *local_768;
  CapTableReader *pCStack_760;
  byte *local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  int iStack_740;
  undefined4 uStack_73c;
  SegmentReader *local_738;
  CapTableReader *pCStack_730;
  byte *local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  int iStack_710;
  undefined4 uStack_70c;
  SegmentReader *local_708;
  CapTableReader *pCStack_700;
  byte *local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  int iStack_6e0;
  undefined4 uStack_6dc;
  SegmentReader *local_6d8;
  CapTableReader *pCStack_6d0;
  byte *local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  int iStack_6b0;
  undefined4 uStack_6ac;
  SegmentReader *local_6a8;
  CapTableReader *pCStack_6a0;
  byte *local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  int iStack_680;
  undefined4 uStack_67c;
  SegmentReader *local_678;
  CapTableReader *pCStack_670;
  byte *local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  int iStack_650;
  undefined4 uStack_64c;
  SegmentReader *local_648;
  CapTableReader *pCStack_640;
  byte *local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  int iStack_620;
  undefined4 uStack_61c;
  SegmentReader *local_618;
  CapTableReader *pCStack_610;
  byte *local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  int iStack_5f0;
  undefined4 uStack_5ec;
  SegmentReader *local_5e8;
  CapTableReader *pCStack_5e0;
  byte *local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  int iStack_5c0;
  undefined4 uStack_5bc;
  SegmentReader *local_5b8;
  CapTableReader *pCStack_5b0;
  byte *local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  int iStack_590;
  undefined4 uStack_58c;
  SegmentReader *local_588;
  CapTableReader *pCStack_580;
  byte *local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  int iStack_560;
  undefined4 uStack_55c;
  SegmentReader *local_558;
  CapTableReader *pCStack_550;
  byte *local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  int iStack_530;
  undefined4 uStack_52c;
  SegmentReader *local_528;
  CapTableReader *pCStack_520;
  byte *local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  int iStack_500;
  undefined4 uStack_4fc;
  SegmentReader *local_4f8;
  CapTableReader *pCStack_4f0;
  byte *local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  int iStack_4d0;
  undefined4 uStack_4cc;
  SegmentReader *local_4c8;
  CapTableReader *pCStack_4c0;
  byte *local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  int iStack_4a0;
  undefined4 uStack_49c;
  SegmentReader *local_498;
  CapTableReader *pCStack_490;
  byte *local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  int iStack_470;
  undefined4 uStack_46c;
  SegmentReader *local_468;
  CapTableReader *pCStack_460;
  byte *local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  int iStack_440;
  undefined4 uStack_43c;
  SegmentReader *local_438;
  CapTableReader *pCStack_430;
  byte *local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  int iStack_410;
  undefined4 uStack_40c;
  SegmentReader *local_408;
  CapTableReader *pCStack_400;
  byte *local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  int iStack_3e0;
  undefined4 uStack_3dc;
  Reader local_3d8;
  Reader local_3a8;
  Reader local_378;
  Reader local_348;
  Reader local_318;
  Reader local_2e8;
  Reader local_2b8;
  Reader local_288;
  Reader local_258;
  Reader local_228;
  Reader local_1f8;
  Reader local_1c8;
  Reader local_198;
  Reader local_168;
  Reader local_138;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  StructBuilder::asReader(&root._builder);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList(&local_138,&reader);
  local_a28._32_6_ = local_138.reader._32_6_;
  local_a28.elementSize = local_138.reader.elementSize;
  local_a28._39_1_ = local_138.reader._39_1_;
  local_a28.nestingLimit = local_138.reader.nestingLimit;
  local_a28._44_4_ = local_138.reader._44_4_;
  local_a28.ptr = local_138.reader.ptr;
  local_a28.elementCount = local_138.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_138.reader.step;
  local_a28.step._2_1_ = local_138.reader.step._2_1_;
  local_a28.step._3_1_ = local_138.reader.step._3_1_;
  local_a28.segment = local_138.reader.segment;
  local_a28.capTable = local_138.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x18);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList(&local_168,&reader);
  local_a28._32_6_ = local_168.reader._32_6_;
  local_a28.elementSize = local_168.reader.elementSize;
  local_a28._39_1_ = local_168.reader._39_1_;
  local_a28.nestingLimit = local_168.reader.nestingLimit;
  local_a28._44_4_ = local_168.reader._44_4_;
  local_a28.ptr = local_168.reader.ptr;
  local_a28.elementCount = local_168.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_168.reader.step;
  local_a28.step._2_1_ = local_168.reader.step._2_1_;
  local_a28.step._3_1_ = local_168.reader.step._3_1_;
  local_a28.segment = local_168.reader.segment;
  local_a28.capTable = local_168.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x20);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List(&local_198,&reader);
  local_a28._32_6_ = local_198.reader._32_6_;
  local_a28.elementSize = local_198.reader.elementSize;
  local_a28._39_1_ = local_198.reader._39_1_;
  local_a28.nestingLimit = local_198.reader.nestingLimit;
  local_a28._44_4_ = local_198.reader._44_4_;
  local_a28.ptr = local_198.reader.ptr;
  local_a28.elementCount = local_198.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_198.reader.step;
  local_a28.step._2_1_ = local_198.reader.step._2_1_;
  local_a28.step._3_1_ = local_198.reader.step._3_1_;
  local_a28.segment = local_198.reader.segment;
  local_a28.capTable = local_198.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x48);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List(&local_1c8,&reader);
  local_a28._32_6_ = local_1c8.reader._32_6_;
  local_a28.elementSize = local_1c8.reader.elementSize;
  local_a28._39_1_ = local_1c8.reader._39_1_;
  local_a28.nestingLimit = local_1c8.reader.nestingLimit;
  local_a28._44_4_ = local_1c8.reader._44_4_;
  local_a28.ptr = local_1c8.reader.ptr;
  local_a28.elementCount = local_1c8.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_1c8.reader.step;
  local_a28.step._2_1_ = local_1c8.reader.step._2_1_;
  local_a28.step._3_1_ = local_1c8.reader.step._3_1_;
  local_a28.segment = local_1c8.reader.segment;
  local_a28.capTable = local_1c8.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x50);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List(&local_1f8,&reader);
  local_a28._32_6_ = local_1f8.reader._32_6_;
  local_a28.elementSize = local_1f8.reader.elementSize;
  local_a28._39_1_ = local_1f8.reader._39_1_;
  local_a28.nestingLimit = local_1f8.reader.nestingLimit;
  local_a28._44_4_ = local_1f8.reader._44_4_;
  local_a28.ptr = local_1f8.reader.ptr;
  local_a28.elementCount = local_1f8.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_1f8.reader.step;
  local_a28.step._2_1_ = local_1f8.reader.step._2_1_;
  local_a28.step._3_1_ = local_1f8.reader.step._3_1_;
  local_a28.segment = local_1f8.reader.segment;
  local_a28.capTable = local_1f8.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x58);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List(&local_228,&reader);
  local_a28._32_6_ = local_228.reader._32_6_;
  local_a28.elementSize = local_228.reader.elementSize;
  local_a28._39_1_ = local_228.reader._39_1_;
  local_a28.nestingLimit = local_228.reader.nestingLimit;
  local_a28._44_4_ = local_228.reader._44_4_;
  local_a28.ptr = local_228.reader.ptr;
  local_a28.elementCount = local_228.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_228.reader.step;
  local_a28.step._2_1_ = local_228.reader.step._2_1_;
  local_a28.step._3_1_ = local_228.reader.step._3_1_;
  local_a28.segment = local_228.reader.segment;
  local_a28.capTable = local_228.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x60);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List(&local_258,&reader);
  local_a28._32_6_ = local_258.reader._32_6_;
  local_a28.elementSize = local_258.reader.elementSize;
  local_a28._39_1_ = local_258.reader._39_1_;
  local_a28.nestingLimit = local_258.reader.nestingLimit;
  local_a28._44_4_ = local_258.reader._44_4_;
  local_a28.ptr = local_258.reader.ptr;
  local_a28.elementCount = local_258.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_258.reader.step;
  local_a28.step._2_1_ = local_258.reader.step._2_1_;
  local_a28.step._3_1_ = local_258.reader.step._3_1_;
  local_a28.segment = local_258.reader.segment;
  local_a28.capTable = local_258.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x28);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List(&local_288,&reader);
  local_a28._32_6_ = local_288.reader._32_6_;
  local_a28.elementSize = local_288.reader.elementSize;
  local_a28._39_1_ = local_288.reader._39_1_;
  local_a28.nestingLimit = local_288.reader.nestingLimit;
  local_a28._44_4_ = local_288.reader._44_4_;
  local_a28.ptr = local_288.reader.ptr;
  local_a28.elementCount = local_288.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_288.reader.step;
  local_a28.step._2_1_ = local_288.reader.step._2_1_;
  local_a28.step._3_1_ = local_288.reader.step._3_1_;
  local_a28.segment = local_288.reader.segment;
  local_a28.capTable = local_288.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x30);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List(&local_2b8,&reader);
  local_a28._32_6_ = local_2b8.reader._32_6_;
  local_a28.elementSize = local_2b8.reader.elementSize;
  local_a28._39_1_ = local_2b8.reader._39_1_;
  local_a28.nestingLimit = local_2b8.reader.nestingLimit;
  local_a28._44_4_ = local_2b8.reader._44_4_;
  local_a28.ptr = local_2b8.reader.ptr;
  local_a28.elementCount = local_2b8.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_2b8.reader.step;
  local_a28.step._2_1_ = local_2b8.reader.step._2_1_;
  local_a28.step._3_1_ = local_2b8.reader.step._3_1_;
  local_a28.segment = local_2b8.reader.segment;
  local_a28.capTable = local_2b8.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x38);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List(&local_2e8,&reader);
  local_a28._32_6_ = local_2e8.reader._32_6_;
  local_a28.elementSize = local_2e8.reader.elementSize;
  local_a28._39_1_ = local_2e8.reader._39_1_;
  local_a28.nestingLimit = local_2e8.reader.nestingLimit;
  local_a28._44_4_ = local_2e8.reader._44_4_;
  local_a28.ptr = local_2e8.reader.ptr;
  local_a28.elementCount = local_2e8.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_2e8.reader.step;
  local_a28.step._2_1_ = local_2e8.reader.step._2_1_;
  local_a28.step._3_1_ = local_2e8.reader.step._3_1_;
  local_a28.segment = local_2e8.reader.segment;
  local_a28.capTable = local_2e8.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x40);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List(&local_318,&reader);
  local_a28._32_6_ = local_318.reader._32_6_;
  local_a28.elementSize = local_318.reader.elementSize;
  local_a28._39_1_ = local_318.reader._39_1_;
  local_a28.nestingLimit = local_318.reader.nestingLimit;
  local_a28._44_4_ = local_318.reader._44_4_;
  local_a28.ptr = local_318.reader.ptr;
  local_a28.elementCount = local_318.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_318.reader.step;
  local_a28.step._2_1_ = local_318.reader.step._2_1_;
  local_a28.step._3_1_ = local_318.reader.step._3_1_;
  local_a28.segment = local_318.reader.segment;
  local_a28.capTable = local_318.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x68);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List(&local_348,&reader);
  local_a28._32_6_ = local_348.reader._32_6_;
  local_a28.elementSize = local_348.reader.elementSize;
  local_a28._39_1_ = local_348.reader._39_1_;
  local_a28.nestingLimit = local_348.reader.nestingLimit;
  local_a28._44_4_ = local_348.reader._44_4_;
  local_a28.ptr = local_348.reader.ptr;
  local_a28.elementCount = local_348.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_348.reader.step;
  local_a28.step._2_1_ = local_348.reader.step._2_1_;
  local_a28.step._3_1_ = local_348.reader.step._3_1_;
  local_a28.segment = local_348.reader.segment;
  local_a28.capTable = local_348.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x70);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList(&local_378,&reader);
  local_a28._32_6_ = local_378.reader._32_6_;
  local_a28.elementSize = local_378.reader.elementSize;
  local_a28._39_1_ = local_378.reader._39_1_;
  local_a28.nestingLimit = local_378.reader.nestingLimit;
  local_a28._44_4_ = local_378.reader._44_4_;
  local_a28.ptr = local_378.reader.ptr;
  local_a28.elementCount = local_378.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_378.reader.step;
  local_a28.step._2_1_ = local_378.reader.step._2_1_;
  local_a28.step._3_1_ = local_378.reader.step._3_1_;
  local_a28.segment = local_378.reader.segment;
  local_a28.capTable = local_378.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x78);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList(&local_3a8,&reader);
  local_a28._32_6_ = local_3a8.reader._32_6_;
  local_a28.elementSize = local_3a8.reader.elementSize;
  local_a28._39_1_ = local_3a8.reader._39_1_;
  local_a28.nestingLimit = local_3a8.reader.nestingLimit;
  local_a28._44_4_ = local_3a8.reader._44_4_;
  local_a28.ptr = local_3a8.reader.ptr;
  local_a28.elementCount = local_3a8.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_3a8.reader.step;
  local_a28.step._2_1_ = local_3a8.reader.step._2_1_;
  local_a28.step._3_1_ = local_3a8.reader.step._3_1_;
  local_a28.segment = local_3a8.reader.segment;
  local_a28.capTable = local_3a8.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x80);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_3d8,&reader);
  local_a28._32_6_ = local_3d8.reader._32_6_;
  local_a28.elementSize = local_3d8.reader.elementSize;
  local_a28._39_1_ = local_3d8.reader._39_1_;
  local_a28.nestingLimit = local_3d8.reader.nestingLimit;
  local_a28._44_4_ = local_3d8.reader._44_4_;
  local_a28.ptr = local_3d8.reader.ptr;
  local_a28.elementCount = local_3d8.reader.elementCount;
  local_a28.step._0_2_ = (undefined2)local_3d8.reader.step;
  local_a28.step._2_1_ = local_3d8.reader.step._2_1_;
  local_a28.step._3_1_ = local_3d8.reader.step._3_1_;
  local_a28.segment = local_3d8.reader.segment;
  local_a28.capTable = local_3d8.reader.capTable;
  local_998.pointer =
       (WirePointer *)
       (CONCAT17(root._builder.pointers._7_1_,
                 CONCAT16(root._builder.pointers._6_1_,root._builder.pointers._0_6_)) + 0x88);
  local_998.segment = root._builder.segment;
  local_998.capTable = root._builder.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextList((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getDataList((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",
               (int *)&local_998,&local_97c);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList((Builder *)&local_a28,&root);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_998.segment = (SegmentBuilder *)((ulong)local_998.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getStructList((Builder *)&local_a28,&root);
    local_97c = local_a28.elementCount;
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",
               (int *)&local_998,&local_97c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_3e8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_3e8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_3e8 >> 0x38,0);
  local_a28.nestingLimit = iStack_3e0;
  local_a28._44_4_ = uStack_3dc;
  local_a28.ptr = local_3f8;
  local_a28.elementCount = (ListElementCount)uStack_3f0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_3f0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_3f0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_3f0 >> 0x38);
  local_a28.segment = local_408;
  local_a28.capTable = pCStack_400;
  local_998.pointer = reader._reader.pointers + 3;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_418,0);
  local_a28.elementSize = (ElementSize)((ulong)local_418 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_418 >> 0x38,0);
  local_a28.nestingLimit = iStack_410;
  local_a28._44_4_ = uStack_40c;
  local_a28.ptr = local_428;
  local_a28.elementCount = (ListElementCount)uStack_420;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_420 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_420 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_420 >> 0x38);
  local_a28.segment = local_438;
  local_a28.capTable = pCStack_430;
  local_998.pointer = reader._reader.pointers + 4;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_448,0);
  local_a28.elementSize = (ElementSize)((ulong)local_448 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_448 >> 0x38,0);
  local_a28.nestingLimit = iStack_440;
  local_a28._44_4_ = uStack_43c;
  local_a28.ptr = local_458;
  local_a28.elementCount = (ListElementCount)uStack_450;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_450 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_450 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_450 >> 0x38);
  local_a28.segment = local_468;
  local_a28.capTable = pCStack_460;
  local_998.pointer = reader._reader.pointers + 9;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_478,0);
  local_a28.elementSize = (ElementSize)((ulong)local_478 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_478 >> 0x38,0);
  local_a28.nestingLimit = iStack_470;
  local_a28._44_4_ = uStack_46c;
  local_a28.ptr = local_488;
  local_a28.elementCount = (ListElementCount)uStack_480;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_480 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_480 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_480 >> 0x38);
  local_a28.segment = local_498;
  local_a28.capTable = pCStack_490;
  local_998.pointer = reader._reader.pointers + 10;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_4a8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_4a8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_4a8 >> 0x38,0);
  local_a28.nestingLimit = iStack_4a0;
  local_a28._44_4_ = uStack_49c;
  local_a28.ptr = local_4b8;
  local_a28.elementCount = (ListElementCount)uStack_4b0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_4b0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_4b0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_4b0 >> 0x38);
  local_a28.segment = local_4c8;
  local_a28.capTable = pCStack_4c0;
  local_998.pointer = reader._reader.pointers + 0xb;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_4d8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_4d8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_4d8 >> 0x38,0);
  local_a28.nestingLimit = iStack_4d0;
  local_a28._44_4_ = uStack_4cc;
  local_a28.ptr = local_4e8;
  local_a28.elementCount = (ListElementCount)uStack_4e0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_4e0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_4e0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_4e0 >> 0x38);
  local_a28.segment = local_4f8;
  local_a28.capTable = pCStack_4f0;
  local_998.pointer = reader._reader.pointers + 0xc;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_508,0);
  local_a28.elementSize = (ElementSize)((ulong)local_508 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_508 >> 0x38,0);
  local_a28.nestingLimit = iStack_500;
  local_a28._44_4_ = uStack_4fc;
  local_a28.ptr = local_518;
  local_a28.elementCount = (ListElementCount)uStack_510;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_510 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_510 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_510 >> 0x38);
  local_a28.segment = local_528;
  local_a28.capTable = pCStack_520;
  local_998.pointer = reader._reader.pointers + 5;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_538,0);
  local_a28.elementSize = (ElementSize)((ulong)local_538 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_538 >> 0x38,0);
  local_a28.nestingLimit = iStack_530;
  local_a28._44_4_ = uStack_52c;
  local_a28.ptr = local_548;
  local_a28.elementCount = (ListElementCount)uStack_540;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_540 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_540 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_540 >> 0x38);
  local_a28.segment = local_558;
  local_a28.capTable = pCStack_550;
  local_998.pointer = reader._reader.pointers + 6;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_568,0);
  local_a28.elementSize = (ElementSize)((ulong)local_568 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_568 >> 0x38,0);
  local_a28.nestingLimit = iStack_560;
  local_a28._44_4_ = uStack_55c;
  local_a28.ptr = local_578;
  local_a28.elementCount = (ListElementCount)uStack_570;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_570 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_570 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_570 >> 0x38);
  local_a28.segment = local_588;
  local_a28.capTable = pCStack_580;
  local_998.pointer = reader._reader.pointers + 7;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_598,0);
  local_a28.elementSize = (ElementSize)((ulong)local_598 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_598 >> 0x38,0);
  local_a28.nestingLimit = iStack_590;
  local_a28._44_4_ = uStack_58c;
  local_a28.ptr = local_5a8;
  local_a28.elementCount = (ListElementCount)uStack_5a0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_5a0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_5a0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_5a0 >> 0x38);
  local_a28.segment = local_5b8;
  local_a28.capTable = pCStack_5b0;
  local_998.pointer = reader._reader.pointers + 8;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_5c8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_5c8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_5c8 >> 0x38,0);
  local_a28.nestingLimit = iStack_5c0;
  local_a28._44_4_ = uStack_5bc;
  local_a28.ptr = local_5d8;
  local_a28.elementCount = (ListElementCount)uStack_5d0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_5d0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_5d0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_5d0 >> 0x38);
  local_a28.segment = local_5e8;
  local_a28.capTable = pCStack_5e0;
  local_998.pointer = reader._reader.pointers + 0xd;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_5f8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_5f8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_5f8 >> 0x38,0);
  local_a28.nestingLimit = iStack_5f0;
  local_a28._44_4_ = uStack_5ec;
  local_a28.ptr = local_608;
  local_a28.elementCount = (ListElementCount)uStack_600;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_600 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_600 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_600 >> 0x38);
  local_a28.segment = local_618;
  local_a28.capTable = pCStack_610;
  local_998.pointer = reader._reader.pointers + 0xe;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_628,0);
  local_a28.elementSize = (ElementSize)((ulong)local_628 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_628 >> 0x38,0);
  local_a28.nestingLimit = iStack_620;
  local_a28._44_4_ = uStack_61c;
  local_a28.ptr = local_638;
  local_a28.elementCount = (ListElementCount)uStack_630;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_630 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_630 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_630 >> 0x38);
  local_a28.segment = local_648;
  local_a28.capTable = pCStack_640;
  local_998.pointer = reader._reader.pointers + 0xf;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_658,0);
  local_a28.elementSize = (ElementSize)((ulong)local_658 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_658 >> 0x38,0);
  local_a28.nestingLimit = iStack_650;
  local_a28._44_4_ = uStack_64c;
  local_a28.ptr = local_668;
  local_a28.elementCount = (ListElementCount)uStack_660;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_660 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_660 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_660 >> 0x38);
  local_a28.segment = local_678;
  local_a28.capTable = pCStack_670;
  local_998.pointer = reader._reader.pointers + 0x10;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)&root,(Builder *)&reader);
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_688,0);
  local_a28.elementSize = (ElementSize)((ulong)local_688 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_688 >> 0x38,0);
  local_a28.nestingLimit = iStack_680;
  local_a28._44_4_ = uStack_67c;
  local_a28.ptr = local_698;
  local_a28.elementCount = (ListElementCount)uStack_690;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_690 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_690 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_690 >> 0x38);
  local_a28.segment = local_6a8;
  local_a28.capTable = pCStack_6a0;
  local_998.pointer = reader._reader.pointers + 0x11;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",(int *)&root
               ,(uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",(int *)&root
               ,(uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",(int *)&root,
               (uint *)&local_998);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader,&builder.super_MessageBuilder);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  local_a28.elementSize = VOID;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  root._builder.data = reader._reader.pointers + 3;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 4;
  local_a28.elementSize = BIT;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 9;
  local_a28.elementSize = BYTE;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 10;
  local_a28.elementSize = TWO_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0xb;
  local_a28.elementSize = FOUR_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0xc;
  local_a28.elementSize = EIGHT_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 5;
  local_a28.elementSize = BYTE;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 6;
  local_a28.elementSize = TWO_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 7;
  local_a28.elementSize = FOUR_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 8;
  local_a28.elementSize = EIGHT_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0xd;
  local_a28.elementSize = FOUR_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0xe;
  local_a28.elementSize = EIGHT_BYTES;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0xf;
  local_a28.elementSize = POINTER;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0x10;
  local_a28.elementSize = POINTER;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  local_a28.ptr = (byte *)0x0;
  local_a28.elementCount = 0;
  local_a28.step._0_2_ = 0;
  local_a28.segment = (SegmentReader *)0x0;
  local_a28.capTable = (CapTableReader *)0x0;
  local_a28.step._2_1_ = 0;
  local_a28.step._3_1_ = 0;
  local_a28.structDataSize = 0;
  local_a28.structPointerCount = 0;
  root._builder.data = reader._reader.pointers + 0x11;
  local_a28.elementSize = INLINE_COMPOSITE;
  local_a28.nestingLimit = 0x7fffffff;
  root._builder.segment = (SegmentBuilder *)reader._reader.segment;
  root._builder.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList((PointerBuilder *)&root,&local_a28,false);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",(int *)&root
               ,(uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",(int *)&root
               ,(uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",(int *)&root,
               (uint *)&local_998);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&reader,&builder.super_MessageBuilder);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.pointers._6_1_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 0;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_6b8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_6b8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_6b8 >> 0x38,0);
  local_a28.nestingLimit = iStack_6b0;
  local_a28._44_4_ = uStack_6ac;
  local_a28.ptr = local_6c8;
  local_a28.elementCount = (ListElementCount)uStack_6c0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_6c0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_6c0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_6c0 >> 0x38);
  local_a28.segment = local_6d8;
  local_a28.capTable = pCStack_6d0;
  local_998.pointer = reader._reader.pointers + 3;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 1;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_6e8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_6e8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_6e8 >> 0x38,0);
  local_a28.nestingLimit = iStack_6e0;
  local_a28._44_4_ = uStack_6dc;
  local_a28.ptr = local_6f8;
  local_a28.elementCount = (ListElementCount)uStack_6f0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_6f0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_6f0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_6f0 >> 0x38);
  local_a28.segment = local_708;
  local_a28.capTable = pCStack_700;
  local_998.pointer = reader._reader.pointers + 4;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 2;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_718,0);
  local_a28.elementSize = (ElementSize)((ulong)local_718 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_718 >> 0x38,0);
  local_a28.nestingLimit = iStack_710;
  local_a28._44_4_ = uStack_70c;
  local_a28.ptr = local_728;
  local_a28.elementCount = (ListElementCount)uStack_720;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_720 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_720 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_720 >> 0x38);
  local_a28.segment = local_738;
  local_a28.capTable = pCStack_730;
  local_998.pointer = reader._reader.pointers + 9;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 3;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_748,0);
  local_a28.elementSize = (ElementSize)((ulong)local_748 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_748 >> 0x38,0);
  local_a28.nestingLimit = iStack_740;
  local_a28._44_4_ = uStack_73c;
  local_a28.ptr = local_758;
  local_a28.elementCount = (ListElementCount)uStack_750;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_750 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_750 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_750 >> 0x38);
  local_a28.segment = local_768;
  local_a28.capTable = pCStack_760;
  local_998.pointer = reader._reader.pointers + 10;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 4;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_778,0);
  local_a28.elementSize = (ElementSize)((ulong)local_778 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_778 >> 0x38,0);
  local_a28.nestingLimit = iStack_770;
  local_a28._44_4_ = uStack_76c;
  local_a28.ptr = local_788;
  local_a28.elementCount = (ListElementCount)uStack_780;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_780 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_780 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_780 >> 0x38);
  local_a28.segment = local_798;
  local_a28.capTable = pCStack_790;
  local_998.pointer = reader._reader.pointers + 0xb;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 5;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_7a8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_7a8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_7a8 >> 0x38,0);
  local_a28.nestingLimit = iStack_7a0;
  local_a28._44_4_ = uStack_79c;
  local_a28.ptr = local_7b8;
  local_a28.elementCount = (ListElementCount)uStack_7b0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_7b0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_7b0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_7b0 >> 0x38);
  local_a28.segment = local_7c8;
  local_a28.capTable = pCStack_7c0;
  local_998.pointer = reader._reader.pointers + 0xc;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 2;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_7d8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_7d8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_7d8 >> 0x38,0);
  local_a28.nestingLimit = iStack_7d0;
  local_a28._44_4_ = uStack_7cc;
  local_a28.ptr = local_7e8;
  local_a28.elementCount = (ListElementCount)uStack_7e0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_7e0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_7e0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_7e0 >> 0x38);
  local_a28.segment = local_7f8;
  local_a28.capTable = pCStack_7f0;
  local_998.pointer = reader._reader.pointers + 5;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 3;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_808,0);
  local_a28.elementSize = (ElementSize)((ulong)local_808 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_808 >> 0x38,0);
  local_a28.nestingLimit = iStack_800;
  local_a28._44_4_ = uStack_7fc;
  local_a28.ptr = local_818;
  local_a28.elementCount = (ListElementCount)uStack_810;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_810 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_810 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_810 >> 0x38);
  local_a28.segment = local_828;
  local_a28.capTable = pCStack_820;
  local_998.pointer = reader._reader.pointers + 6;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 4;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_838,0);
  local_a28.elementSize = (ElementSize)((ulong)local_838 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_838 >> 0x38,0);
  local_a28.nestingLimit = iStack_830;
  local_a28._44_4_ = uStack_82c;
  local_a28.ptr = local_848;
  local_a28.elementCount = (ListElementCount)uStack_840;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_840 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_840 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_840 >> 0x38);
  local_a28.segment = local_858;
  local_a28.capTable = pCStack_850;
  local_998.pointer = reader._reader.pointers + 7;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 5;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_868,0);
  local_a28.elementSize = (ElementSize)((ulong)local_868 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_868 >> 0x38,0);
  local_a28.nestingLimit = iStack_860;
  local_a28._44_4_ = uStack_85c;
  local_a28.ptr = local_878;
  local_a28.elementCount = (ListElementCount)uStack_870;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_870 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_870 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_870 >> 0x38);
  local_a28.segment = local_888;
  local_a28.capTable = pCStack_880;
  local_998.pointer = reader._reader.pointers + 8;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 4;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_898,0);
  local_a28.elementSize = (ElementSize)((ulong)local_898 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_898 >> 0x38,0);
  local_a28.nestingLimit = iStack_890;
  local_a28._44_4_ = uStack_88c;
  local_a28.ptr = local_8a8;
  local_a28.elementCount = (ListElementCount)uStack_8a0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_8a0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_8a0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_8a0 >> 0x38);
  local_a28.segment = local_8b8;
  local_a28.capTable = pCStack_8b0;
  local_998.pointer = reader._reader.pointers + 0xd;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 5;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_8c8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_8c8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_8c8 >> 0x38,0);
  local_a28.nestingLimit = iStack_8c0;
  local_a28._44_4_ = uStack_8bc;
  local_a28.ptr = local_8d8;
  local_a28.elementCount = (ListElementCount)uStack_8d0;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_8d0 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_8d0 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_8d0 >> 0x38);
  local_a28.segment = local_8e8;
  local_a28.capTable = pCStack_8e0;
  local_998.pointer = reader._reader.pointers + 0xe;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 6;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_8f8,0);
  local_a28.elementSize = (ElementSize)((ulong)local_8f8 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_8f8 >> 0x38,0);
  local_a28.nestingLimit = iStack_8f0;
  local_a28._44_4_ = uStack_8ec;
  local_a28.ptr = local_908;
  local_a28.elementCount = (ListElementCount)uStack_900;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_900 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_900 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_900 >> 0x38);
  local_a28.segment = local_918;
  local_a28.capTable = pCStack_910;
  local_998.pointer = reader._reader.pointers + 0xf;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 6;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_928,0);
  local_a28.elementSize = (ElementSize)((ulong)local_928 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_928 >> 0x38,0);
  local_a28.nestingLimit = iStack_920;
  local_a28._44_4_ = uStack_91c;
  local_a28.ptr = local_938;
  local_a28.elementCount = (ListElementCount)uStack_930;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_930 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_930 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_930 >> 0x38);
  local_a28.segment = local_948;
  local_a28.capTable = pCStack_940;
  local_998.pointer = reader._reader.pointers + 0x10;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  root._builder.data = (void *)0x0;
  root._builder.pointers._0_6_ = 0;
  root._builder.segment = (SegmentBuilder *)0x0;
  root._builder.capTable = (CapTableBuilder *)0x0;
  root._builder.pointers._6_1_ = 0;
  root._builder.pointers._7_1_ = 0;
  root._builder.dataSize = 0;
  root._builder.pointerCount = 0;
  root._builder._38_1_ = 7;
  ListBuilder::asReader((ListBuilder *)&root);
  local_a28._32_6_ = SUB86(local_958,0);
  local_a28.elementSize = (ElementSize)((ulong)local_958 >> 0x30);
  local_a28._39_1_ = SUB81((ulong)local_958 >> 0x38,0);
  local_a28.nestingLimit = iStack_950;
  local_a28._44_4_ = uStack_94c;
  local_a28.ptr = local_968;
  local_a28.elementCount = (ListElementCount)uStack_960;
  local_a28.step._0_2_ = (undefined2)((ulong)uStack_960 >> 0x20);
  local_a28.step._2_1_ = (undefined1)((ulong)uStack_960 >> 0x30);
  local_a28.step._3_1_ = (undefined1)((ulong)uStack_960 >> 0x38);
  local_a28.segment = local_978;
  local_a28.capTable = pCStack_970;
  local_998.pointer = reader._reader.pointers + 0x11;
  local_998.segment = (SegmentBuilder *)reader._reader.segment;
  local_998.capTable = (CapTableBuilder *)reader._reader.capTable;
  PointerBuilder::setList(&local_998,&local_a28,false);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasVoidList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasVoidList()\"",
               (char (*) [36])"failed: expected root.hasVoidList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getVoidList().size())\", 0, root.getVoidList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getVoidList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasBoolList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasBoolList()\"",
               (char (*) [36])"failed: expected root.hasBoolList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getBoolList().size())\", 0, root.getBoolList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getBoolList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt8List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt8List()\"",
               (char (*) [37])"failed: expected root.hasUInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt8List().size())\", 0, root.getUInt8List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getUInt8List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt16List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt16List()\"",
               (char (*) [38])"failed: expected root.hasUInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt16List().size())\", 0, root.getUInt16List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt16List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt32List()\"",
               (char (*) [38])"failed: expected root.hasUInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt32List().size())\", 0, root.getUInt32List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt32List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasUInt64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasUInt64List()\"",
               (char (*) [38])"failed: expected root.hasUInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getUInt64List().size())\", 0, root.getUInt64List().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getUInt64List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt8List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt8List()\"",
               (char (*) [36])"failed: expected root.hasInt8List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt8List().size())\", 0, root.getInt8List().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getInt8List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt16List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt16List()\"",
               (char (*) [37])"failed: expected root.hasInt16List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt16List().size())\", 0, root.getInt16List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt16List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt32List().size())\", 0, root.getInt32List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt32List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasInt64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasInt64List()\"",
               (char (*) [37])"failed: expected root.hasInt64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getInt64List().size())\", 0, root.getInt64List().size()"
               ,(char (*) [53])"failed: expected (0) == (root.getInt64List().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat32List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat32List()\"",
               (char (*) [39])"failed: expected root.hasFloat32List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat32List().size())\", 0, root.getFloat32List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat32List().size())",(int *)&root
               ,(uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasFloat64List((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasFloat64List()\"",
               (char (*) [39])"failed: expected root.hasFloat64List()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[55],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getFloat64List().size())\", 0, root.getFloat64List().size()"
               ,(char (*) [55])"failed: expected (0) == (root.getFloat64List().size())",(int *)&root
               ,(uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasTextList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasTextList()\"",
               (char (*) [36])"failed: expected root.hasTextList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getTextList().size())\", 0, root.getTextList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getTextList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasDataList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasDataList()\"",
               (char (*) [36])"failed: expected root.hasDataList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getDataList().size())\", 0, root.getDataList().size()"
               ,(char (*) [52])"failed: expected (0) == (root.getDataList().size())",(int *)&root,
               (uint *)&local_998);
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)&reader);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
               (char (*) [38])"failed: expected root.hasStructList()");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)&local_a28,(Builder *)&reader);
  if ((local_a28.elementCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    root._builder.segment = (SegmentBuilder *)((ulong)root._builder.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
              ((Builder *)&local_a28,(Builder *)&reader);
    local_998.segment = (SegmentBuilder *)CONCAT44(local_998.segment._4_4_,local_a28.elementCount);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0) == (root.getStructList().size())\", 0, root.getStructList().size()"
               ,(char (*) [54])"failed: expected (0) == (root.getStructList().size())",(int *)&root,
               (uint *)&local_998);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, SetListToEmpty) {
  // Test initializing list fields from various ways of constructing zero-sized lists.
  // At one point this would often fail because the lists would have ElementSize::VOID which is
  // incompatible with other list sizes.

#define ALL_LIST_TYPES(MACRO) \
  MACRO(Void, Void) \
  MACRO(Bool, bool) \
  MACRO(UInt8, uint8_t) \
  MACRO(UInt16, uint16_t) \
  MACRO(UInt32, uint32_t) \
  MACRO(UInt64, uint64_t) \
  MACRO(Int8, int8_t) \
  MACRO(Int16, int16_t) \
  MACRO(Int32, int32_t) \
  MACRO(Int64, int64_t) \
  MACRO(Float32, float) \
  MACRO(Float64, double) \
  MACRO(Text, Text) \
  MACRO(Data, Data) \
  MACRO(Struct, TestAllTypes)

#define SET_FROM_READER_ACCESSOR(name, type) \
  root.set##name##List(reader.get##name##List());

#define SET_FROM_BUILDER_ACCESSOR(name, type) \
  root.set##name##List(root.get##name##List());

#define SET_FROM_READER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Reader());

#define SET_FROM_BUILDER_CONSTRUCTOR(name, type) \
  root.set##name##List(List<type>::Builder());

#define CHECK_EMPTY_NONNULL(name, type) \
  EXPECT_TRUE(root.has##name##List()); \
  EXPECT_EQ(0, root.get##name##List().size());

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    auto reader = root.asReader();
    ALL_LIST_TYPES(SET_FROM_READER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_ACCESSOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_READER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

  {
    MallocMessageBuilder builder;
    auto root = builder.initRoot<test::TestAllTypes>();
    ALL_LIST_TYPES(SET_FROM_BUILDER_CONSTRUCTOR)
    ALL_LIST_TYPES(CHECK_EMPTY_NONNULL)
  }

#undef SET_FROM_READER_ACCESSOR
#undef SET_FROM_BUILDER_ACCESSOR
#undef SET_FROM_READER_CONSTRUCTOR
#undef SET_FROM_BUILDER_CONSTRUCTOR
#undef CHECK_EMPTY_NONNULL
}